

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_read_collapsed_image(nifti_image *nim,int *dims,void **data)

{
  char *data_00;
  int iVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  znzFile file;
  size_t base_offset;
  ulong uVar5;
  uint uVar6;
  uint nprods;
  znzFile fp;
  int pivots [8];
  int prods [8];
  
  if (((nim == (nifti_image *)0x0) || (dims == (int *)0x0)) || (data == (void **)0x0)) {
    fprintf(_stderr,"** nifti_RCI: bad params %p, %p, %p\n",nim,dims,data);
  }
  else {
    iVar1 = g_opts_0;
    if (2 < g_opts_0) {
      nifti_read_collapsed_image_cold_1();
      iVar1 = pivots[0];
    }
    iVar1 = nifti_nim_is_valid(nim,(uint)(0 < iVar1));
    if (iVar1 == 0) {
      nifti_read_collapsed_image_cold_3();
    }
    else {
      uVar3 = (ulong)(uint)nim->dim[0];
      if (nim->dim[0] < 1) {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if (nim->dim[uVar5 + 1] <= dims[uVar5 + 1]) {
            fprintf(_stderr,"** nifti_RCI: dims[%d] >= nim->dim[%d] (%d,%d)\n",
                    (ulong)((int)uVar5 + 1));
            return -1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
        uVar5 = 0;
        do {
          prods[uVar5] = 1;
          iVar1 = 1;
          while( true ) {
            iVar2 = (int)uVar3;
            if ((nim->dim[uVar3] != 1) && (dims[uVar3] != -1)) break;
            iVar1 = iVar1 * nim->dim[uVar3];
            prods[uVar5] = iVar1;
            uVar3 = uVar3 - 1;
            if (iVar2 < 2) {
              pivots[uVar5] = 0;
              uVar5 = uVar5 + 1;
              goto LAB_001116b8;
            }
          }
          pivots[uVar5] = iVar2;
          uVar5 = uVar5 + 1;
          uVar3 = (ulong)(iVar2 - 1);
        } while (1 < iVar2);
      }
LAB_001116b8:
      nprods = (uint)uVar5;
      uVar5 = uVar5 & 0xffffffff;
      if (pivots[uVar5 - 1] != 0) {
        pivots[uVar5] = 0;
        prods[uVar5] = 1;
        nprods = nprods + 1;
      }
      if (2 < g_opts_0) {
        nifti_read_collapsed_image_cold_2();
      }
      uVar6 = nim->nbyper;
      if ((nprods - 9 < 0xfffffff8) || ((int)uVar6 < 0)) {
        fprintf(_stderr,"** rci_am: bad params, %d, %d\n",(ulong)uVar6,(ulong)nprods);
      }
      else {
        iVar1 = 1;
        uVar3 = 0;
        do {
          iVar1 = iVar1 * prods[uVar3];
          uVar3 = uVar3 + 1;
        } while (nprods != uVar3);
        uVar6 = iVar1 * uVar6;
        if (*data == (void *)0x0) {
          if (1 < g_opts_0) {
            fprintf(_stderr,"+d alloc %d (= %d x %d) bytes for collapsed image\n",(ulong)uVar6);
          }
          pvVar4 = malloc((long)(int)uVar6);
          *data = pvVar4;
          if (pvVar4 == (void *)0x0) {
            fprintf(_stderr,"** rci_am: failed to alloc %d bytes for data\n",(ulong)uVar6);
            return -1;
          }
        }
        else if (1 < g_opts_0) {
          fprintf(_stderr,"-d rci_am: *data already set, need %d (%d x %d) bytes\n",(ulong)uVar6);
        }
        if ((int)uVar6 < 0) {
          return -1;
        }
        file = nifti_image_load_prep(nim);
        data_00 = (char *)*data;
        fp = file;
        if (file == (znzFile)0x0) {
          free(data_00);
          *data = (void *)0x0;
        }
        else {
          base_offset = znztell(file);
          iVar1 = rci_read_data(nim,pivots,prods,nprods,dims,data_00,file,base_offset);
          Xznzclose(&fp);
          if (-1 < iVar1) {
            if (1 < g_opts_0) {
              fprintf(_stderr,"+d read %d bytes of collapsed image from %s\n",(ulong)uVar6,
                      nim->fname);
              return uVar6;
            }
            return uVar6;
          }
          free(*data);
          *data = (void *)0x0;
        }
      }
    }
  }
  return -1;
}

Assistant:

int nifti_read_collapsed_image( nifti_image * nim, const int dims [8],
                                void ** data )
{
   znzFile fp;
   int     pivots[8], prods[8], nprods; /* sizes are bounded by dims[], so 8 */
   int     c, bytes;

   /** - check pointers for sanity */
   if( !nim || !dims || !data ){
      fprintf(stderr,"** nifti_RCI: bad params %p, %p, %p\n",
              (void *)nim, (const void *)dims, (void *)data);
      return -1;
   }

   if( g_opts.debug > 2 ){
      fprintf(stderr,"-d read_collapsed_image:\n        dims =");
      for(c = 0; c < 8; c++) fprintf(stderr," %3d", dims[c]);
      fprintf(stderr,"\n   nim->dims =");
      for(c = 0; c < 8; c++) fprintf(stderr," %3d", nim->dim[c]);
      fputc('\n', stderr);
   }

   /** - verify that dim[] makes sense */
   if( ! nifti_nim_is_valid(nim, g_opts.debug > 0) ){
      fprintf(stderr,"** invalid nim (file is '%s')\n", nim->fname );
      return -1;
   }

   /** - verify that dims[] makes sense for this dataset */
   for( c = 1; c <= nim->dim[0]; c++ ){
      if( dims[c] >= nim->dim[c] ){
         fprintf(stderr,"** nifti_RCI: dims[%d] >= nim->dim[%d] (%d,%d)\n",
                 c, c, dims[c], nim->dim[c]);
         return -1;
      }
   }

   /** - prepare pivot list - pivots are fixed indices */
   if( make_pivot_list(nim, dims, pivots, prods, &nprods) < 0 ) return -1;

   bytes = rci_alloc_mem(data, prods, nprods, nim->nbyper);
   if( bytes < 0 ) return -1;

   /** - open the image file for reading at the appropriate offset */
   fp = nifti_image_load_prep( nim );
   if( ! fp ){ free(*data);  *data = NULL;  return -1; }     /* failure */

   /** - call the recursive reading function, passing nim, the pivot info,
         location to store memory, and file pointer and position */
   c = rci_read_data(nim, pivots,prods,nprods,dims,
                     (char *)*data, fp, znztell(fp));
   znzclose(fp);   /* in any case, close the file */
   if( c < 0 ){ free(*data);  *data = NULL;  return -1; }    /* failure */

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d read %d bytes of collapsed image from %s\n",
              bytes, nim->fname);

   return bytes;
}